

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O3

void __thiscall wasm::ToolOptions::applyFeatures(ToolOptions *this,Module *module)

{
  uint uVar1;
  int iVar2;
  Fatal local_198;
  
  uVar1 = (module->features).features | (this->enabledFeatures).features;
  (module->features).features = uVar1;
  uVar1 = ~(this->disabledFeatures).features & uVar1;
  (module->features).features = uVar1 & 0x1ffff;
  if ((uVar1 >> 10 & 1) == 0) {
    iVar2 = wasm::getTypeSystem();
    if (iVar2 == 1) {
      Fatal::Fatal(&local_198);
      Fatal::operator<<(&local_198,
                        (char (*) [50])"Nominal typing is only allowed when GC is enabled");
      Fatal::~Fatal(&local_198);
    }
  }
  return;
}

Assistant:

void applyFeatures(Module& module) const {
    module.features.enable(enabledFeatures);
    module.features.disable(disabledFeatures);
    // Non-default type systems only make sense with GC enabled.
    if (!module.features.hasGC() && getTypeSystem() == TypeSystem::Nominal) {
      Fatal() << "Nominal typing is only allowed when GC is enabled";
    }
  }